

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O3

int __thiscall FIX::IntField::getValue(IntField *this)

{
  signed_int sVar1;
  
  sVar1 = IntConvertor::convert(&(this->super_FieldBase).m_string);
  return sVar1;
}

Assistant:

int getValue() const EXCEPT ( IncorrectDataFormat )
    { try
      { return IntConvertor::convert( getString() ); }
      catch( FieldConvertError& )
      { throw IncorrectDataFormat( getTag(), getString() ); } }